

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O2

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<390u,Fixpp::Type::String>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<(char)108>,Fixpp::TagT<390u,Fixpp::Type::String>,Fixpp::TagT<391u,Fixpp::Type::String>,Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::Required<Fixpp::TagT<12u,Fixpp::Type::Float>>,Fixpp::Required<Fixpp::TagT<13u,Fixpp::Type::Char>>,Fixpp::TagT<66u,Fixpp::Type::String>,Fixpp::TagT<421u,Fixpp::Type::String>,Fixpp::TagT<54u,Fixpp::Type::Char>,Fixpp::TagT<44u,Fixpp::Type::Float>,Fixpp::TagT<423u,Fixpp::Type::Int>,Fixpp::TagT<406u,Fixpp::Type::Float>,Fixpp::TagT<430u,Fixpp::Type::Int>,Fixpp::TagT<63u,Fixpp::Type::Char>,Fixpp::TagT<64u,Fixpp::Type::String>,Fixpp::TagT<336u,Fixpp::Type::String>,Fixpp::TagT<58u,Fixpp::Type::String>,Fixpp::TagT<354u,Fixpp::Type::Int>,Fixpp::TagT<355u,Fixpp::Type::Data>>>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<390u,Fixpp::Type::String>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_l_>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>_>
          *tagSet,bool param_4,bool param_5)

{
  StreamCursor *cursor;
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  char *pcVar5;
  Type type;
  
  cursor = context->cursor;
  lVar1 = *(long *)&cursor->buf->field_0x8;
  pcVar5 = *(char **)&cursor->buf->field_0x10;
  bVar4 = match_until_fast('|',cursor);
  if (bVar4) {
    lVar2 = *(long *)&cursor->buf->field_0x8;
    lVar3 = *(long *)&cursor->buf->field_0x10;
    bVar4 = StreamCursor::advance(cursor,1);
    if (bVar4) {
      (field->m_view).first = pcVar5;
      (field->m_view).second = (lVar1 + lVar3) - (long)(pcVar5 + lVar2);
      TagSet<Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
      ::set(&tagSet->
             super_TagSet<Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::SmallRepeatingGroup<Fixpp::TagT<420U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::Required<Fixpp::TagT<12U,_Fixpp::Type::Float>_>,_Fixpp::Required<Fixpp::TagT<13U,_Fixpp::Type::Char>_>,_Fixpp::TagT<66U,_Fixpp::Type::String>,_Fixpp::TagT<421U,_Fixpp::Type::String>,_Fixpp::TagT<54U,_Fixpp::Type::Char>,_Fixpp::TagT<44U,_Fixpp::Type::Float>,_Fixpp::TagT<423U,_Fixpp::Type::Int>,_Fixpp::TagT<406U,_Fixpp::Type::Float>,_Fixpp::TagT<430U,_Fixpp::Type::Int>,_Fixpp::TagT<63U,_Fixpp::Type::Char>,_Fixpp::TagT<64U,_Fixpp::Type::String>,_Fixpp::TagT<336U,_Fixpp::Type::String>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>_>
            ,0x186);
      return;
    }
    pcVar5 = "Expected value after tag \'%d\', got EOF";
    type = Incomplete;
  }
  else {
    pcVar5 = "Expected value tag \'%d\', got EOF";
    type = ParsingError;
  }
  ParsingContext::setError(context,type,pcVar5,0x186);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }